

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_graph_get_tensor(ggml_cgraph *cgraph,char *name)

{
  int iVar1;
  ggml_tensor **ppgVar2;
  ggml_tensor *pgVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = cgraph->n_leafs;
  if (0 < (long)iVar1) {
    ppgVar2 = cgraph->leafs;
    lVar5 = 0;
    do {
      pgVar3 = ppgVar2[lVar5];
      iVar4 = strcmp(pgVar3->name,name);
      if (iVar4 == 0) {
        return pgVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  iVar1 = cgraph->n_nodes;
  if (0 < (long)iVar1) {
    ppgVar2 = cgraph->nodes;
    lVar5 = 0;
    do {
      pgVar3 = ppgVar2[lVar5];
      iVar4 = strcmp(pgVar3->name,name);
      if (iVar4 == 0) {
        return pgVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (ggml_tensor *)0x0;
}

Assistant:

struct ggml_tensor * ggml_graph_get_tensor(const struct ggml_cgraph * cgraph, const char * name) {
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * leaf = cgraph->leafs[i];

        if (strcmp(leaf->name, name) == 0) {
            return leaf;
        }
    }

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (strcmp(node->name, name) == 0) {
            return node;
        }
    }

    return NULL;
}